

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O3

void demo_draw(demo *demo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  VkResult VVar3;
  long lVar4;
  undefined8 *puVar5;
  VkImageMemoryBarrier *pVVar6;
  byte bVar7;
  VkSemaphore imageAcquiredSemaphore;
  VkSemaphore drawCompleteSemaphore;
  VkPipelineStageFlags pipe_stage_flags;
  void *local_188;
  VkRenderPass local_180;
  VkFramebuffer local_178;
  VkOffset2D local_170;
  VkExtent2D local_168;
  uint32_t local_160;
  VkClearValue *local_158;
  VkDeviceSize offsets [1];
  VkSemaphoreCreateInfo semaphoreCreateInfo;
  VkRect2D local_130;
  VkViewport local_120;
  VkClearValue local_108;
  float local_f8;
  undefined4 local_f4;
  VkCommandBufferBeginInfo cmd_buf_info;
  VkPresentInfoKHR present;
  VkSubmitInfo submit_info;
  
  bVar7 = 0;
  semaphoreCreateInfo.flags = 0;
  semaphoreCreateInfo._20_4_ = 0;
  semaphoreCreateInfo.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
  semaphoreCreateInfo._4_4_ = 0;
  semaphoreCreateInfo.pNext = (void *)0x0;
  VVar3 = (*glad_vkCreateSemaphore)
                    (demo->device,&semaphoreCreateInfo,(VkAllocationCallbacks *)0x0,
                     &imageAcquiredSemaphore);
  if (VVar3 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x1f0,"void demo_draw(struct demo *)");
  }
  VVar3 = (*glad_vkCreateSemaphore)
                    (demo->device,&semaphoreCreateInfo,(VkAllocationCallbacks *)0x0,
                     &drawCompleteSemaphore);
  if (VVar3 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,500,"void demo_draw(struct demo *)");
  }
  VVar3 = (*glad_vkAcquireNextImageKHR)
                    (demo->device,demo->swapchain,0xffffffffffffffff,imageAcquiredSemaphore,
                     (VkFence)0x0,&demo->current_buffer);
  if ((VVar3 == VK_SUBOPTIMAL_KHR) || (VVar3 == VK_SUCCESS)) {
    demo_flush_init_cmd(demo);
    cmd_buf_info.flags = 0;
    cmd_buf_info._20_4_ = 0;
    cmd_buf_info.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
    cmd_buf_info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
    cmd_buf_info._4_4_ = 0;
    cmd_buf_info.pNext = (void *)0x0;
    local_158 = &local_108;
    local_108.depthStencil.depth = 0.2;
    local_108.depthStencil.stencil = 0x3e4ccccd;
    local_108._8_8_ = 0x3e4ccccd3e4ccccd;
    local_f8 = demo->depthStencil;
    local_f4 = 0;
    pipe_stage_flags = 0x2b;
    local_188 = (void *)0x0;
    local_180 = demo->render_pass;
    local_178 = demo->framebuffers[demo->current_buffer];
    local_170.x = 0;
    local_170.y = 0;
    local_168.width = demo->width;
    local_168.height = demo->height;
    local_160 = 2;
    VVar3 = (*glad_vkBeginCommandBuffer)(demo->draw_cmd,&cmd_buf_info);
    if (VVar3 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x19f,"void demo_draw_build_cmd(struct demo *)");
    }
    submit_info.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    submit_info.pNext = (void *)0x0;
    submit_info.waitSemaphoreCount = 0;
    submit_info._20_4_ = 0x100;
    submit_info.pWaitSemaphores = (VkSemaphore *)0x200000000;
    submit_info.pWaitDstStageMask = (VkPipelineStageFlags *)0xffffffffffffffff;
    submit_info._40_8_ = demo->buffers[demo->current_buffer].image;
    submit_info.pCommandBuffers = (VkCommandBuffer *)0x1;
    submit_info.signalSemaphoreCount = 1;
    submit_info._60_4_ = 0;
    submit_info.pSignalSemaphores = (VkSemaphore *)CONCAT44(submit_info.pSignalSemaphores._4_4_,1);
    (*glad_vkCmdPipelineBarrier)
              (demo->draw_cmd,0x10000,0x2000,0,0,(VkMemoryBarrier *)0x0,0,
               (VkBufferMemoryBarrier *)0x0,1,(VkImageMemoryBarrier *)&submit_info);
    (*glad_vkCmdBeginRenderPass)
              (demo->draw_cmd,(VkRenderPassBeginInfo *)&pipe_stage_flags,VK_SUBPASS_CONTENTS_INLINE)
    ;
    (*glad_vkCmdBindPipeline)(demo->draw_cmd,VK_PIPELINE_BIND_POINT_GRAPHICS,demo->pipeline);
    (*glad_vkCmdBindDescriptorSets)
              (demo->draw_cmd,VK_PIPELINE_BIND_POINT_GRAPHICS,demo->pipeline_layout,0,1,
               &demo->desc_set,0,(uint32_t *)0x0);
    local_120.x = 0.0;
    local_120.y = 0.0;
    uVar1 = demo->width;
    uVar2 = demo->height;
    local_120.width = (float)(int)uVar1;
    local_120.height = (float)(int)uVar2;
    local_120.minDepth = 0.0;
    local_120.maxDepth = 1.0;
    (*glad_vkCmdSetViewport)(demo->draw_cmd,0,1,&local_120);
    local_130.extent.width = demo->width;
    local_130.extent.height = demo->height;
    local_130.offset.x = 0;
    local_130.offset.y = 0;
    (*glad_vkCmdSetScissor)(demo->draw_cmd,0,1,&local_130);
    offsets[0] = 0;
    (*glad_vkCmdBindVertexBuffers)(demo->draw_cmd,0,1,&(demo->vertices).buf,offsets);
    (*glad_vkCmdDraw)(demo->draw_cmd,3,1,0,0);
    (*glad_vkCmdEndRenderPass)(demo->draw_cmd);
    puVar5 = &DAT_00124f28;
    pVVar6 = (VkImageMemoryBarrier *)&present;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)pVVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      pVVar6 = (VkImageMemoryBarrier *)((long)pVVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    present.pSwapchains = (VkSwapchainKHR *)demo->buffers[demo->current_buffer].image;
    (*glad_vkCmdPipelineBarrier)
              (demo->draw_cmd,0x10000,0x2000,0,0,(VkMemoryBarrier *)0x0,0,
               (VkBufferMemoryBarrier *)0x0,1,(VkImageMemoryBarrier *)&present);
    VVar3 = (*glad_vkEndCommandBuffer)(demo->draw_cmd);
    if (VVar3 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x1e2,"void demo_draw_build_cmd(struct demo *)");
    }
    submit_info.pCommandBuffers = &demo->draw_cmd;
    pipe_stage_flags = 0x2000;
    submit_info.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submit_info.pNext = (void *)0x0;
    submit_info.waitSemaphoreCount = 1;
    submit_info.pWaitSemaphores = &imageAcquiredSemaphore;
    submit_info.commandBufferCount = 1;
    submit_info.signalSemaphoreCount = 1;
    submit_info.pWaitDstStageMask = &pipe_stage_flags;
    submit_info.pSignalSemaphores = &drawCompleteSemaphore;
    VVar3 = (*glad_vkQueueSubmit)(demo->queue,1,&submit_info,(VkFence)0x0);
    if (VVar3 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x220,"void demo_draw(struct demo *)");
    }
    present.pSwapchains = &demo->swapchain;
    present.sType = VK_STRUCTURE_TYPE_PRESENT_INFO_KHR;
    present.pNext = (void *)0x0;
    present.waitSemaphoreCount = 1;
    present.swapchainCount = 1;
    present.pResults = (VkResult *)0x0;
    present.pWaitSemaphores = &drawCompleteSemaphore;
    present.pImageIndices = &demo->current_buffer;
    VVar3 = (*glad_vkQueuePresentKHR)(demo->queue,&present);
    if ((VVar3 != VK_SUBOPTIMAL_KHR) && (VVar3 != VK_SUCCESS)) {
      if (VVar3 != VK_ERROR_OUT_OF_DATE_KHR) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                      ,0x235,"void demo_draw(struct demo *)");
      }
      demo_resize(demo);
    }
    VVar3 = (*glad_vkQueueWaitIdle)(demo->queue);
    if (VVar3 != VK_SUCCESS) {
      __assert_fail("err == VK_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x239,"void demo_draw(struct demo *)");
    }
  }
  else {
    if (VVar3 != VK_ERROR_OUT_OF_DATE_KHR) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x207,"void demo_draw(struct demo *)");
    }
    demo_resize(demo);
    demo_draw(demo);
  }
  (*glad_vkDestroySemaphore)(demo->device,imageAcquiredSemaphore,(VkAllocationCallbacks *)0x0);
  (*glad_vkDestroySemaphore)(demo->device,drawCompleteSemaphore,(VkAllocationCallbacks *)0x0);
  return;
}

Assistant:

static void demo_draw(struct demo *demo) {
    VkResult U_ASSERT_ONLY err;
    VkSemaphore imageAcquiredSemaphore, drawCompleteSemaphore;
    VkSemaphoreCreateInfo semaphoreCreateInfo = {
        .sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO,
        .pNext = NULL,
        .flags = 0,
    };

    err = vkCreateSemaphore(demo->device, &semaphoreCreateInfo,
                            NULL, &imageAcquiredSemaphore);
    assert(!err);

    err = vkCreateSemaphore(demo->device, &semaphoreCreateInfo,
                            NULL, &drawCompleteSemaphore);
    assert(!err);

    // Get the index of the next available swapchain image:
    err = vkAcquireNextImageKHR(demo->device, demo->swapchain, UINT64_MAX,
                                imageAcquiredSemaphore,
                                (VkFence)0, // TODO: Show use of fence
                                &demo->current_buffer);
    if (err == VK_ERROR_OUT_OF_DATE_KHR) {
        // demo->swapchain is out of date (e.g. the window was resized) and
        // must be recreated:
        demo_resize(demo);
        demo_draw(demo);
        vkDestroySemaphore(demo->device, imageAcquiredSemaphore, NULL);
        vkDestroySemaphore(demo->device, drawCompleteSemaphore, NULL);
        return;
    } else if (err == VK_SUBOPTIMAL_KHR) {
        // demo->swapchain is not as optimal as it could be, but the platform's
        // presentation engine will still present the image correctly.
    } else {
        assert(!err);
    }

    demo_flush_init_cmd(demo);

    // Wait for the present complete semaphore to be signaled to ensure
    // that the image won't be rendered to until the presentation
    // engine has fully released ownership to the application, and it is
    // okay to render to the image.

    demo_draw_build_cmd(demo);
    VkFence nullFence = VK_NULL_HANDLE;
    VkPipelineStageFlags pipe_stage_flags =
        VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT;
    VkSubmitInfo submit_info = {.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
                                .pNext = NULL,
                                .waitSemaphoreCount = 1,
                                .pWaitSemaphores = &imageAcquiredSemaphore,
                                .pWaitDstStageMask = &pipe_stage_flags,
                                .commandBufferCount = 1,
                                .pCommandBuffers = &demo->draw_cmd,
                                .signalSemaphoreCount = 1,
                                .pSignalSemaphores = &drawCompleteSemaphore};

    err = vkQueueSubmit(demo->queue, 1, &submit_info, nullFence);
    assert(!err);

    VkPresentInfoKHR present = {
        .sType = VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
        .pNext = NULL,
        .waitSemaphoreCount = 1,
        .pWaitSemaphores = &drawCompleteSemaphore,
        .swapchainCount = 1,
        .pSwapchains = &demo->swapchain,
        .pImageIndices = &demo->current_buffer,
    };

    err = vkQueuePresentKHR(demo->queue, &present);
    if (err == VK_ERROR_OUT_OF_DATE_KHR) {
        // demo->swapchain is out of date (e.g. the window was resized) and
        // must be recreated:
        demo_resize(demo);
    } else if (err == VK_SUBOPTIMAL_KHR) {
        // demo->swapchain is not as optimal as it could be, but the platform's
        // presentation engine will still present the image correctly.
    } else {
        assert(!err);
    }

    err = vkQueueWaitIdle(demo->queue);
    assert(err == VK_SUCCESS);

    vkDestroySemaphore(demo->device, imageAcquiredSemaphore, NULL);
    vkDestroySemaphore(demo->device, drawCompleteSemaphore, NULL);
}